

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_name_match_unittest.cc
# Opt level: O0

void __thiscall
bssl::VerifyNameMatchInvalidDataTest_FailOnEmptyRdn_Test::
VerifyNameMatchInvalidDataTest_FailOnEmptyRdn_Test
          (VerifyNameMatchInvalidDataTest_FailOnEmptyRdn_Test *this)

{
  VerifyNameMatchInvalidDataTest_FailOnEmptyRdn_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__VerifyNameMatchInvalidDataTest_FailOnEmptyRdn_Test_00945078;
  return;
}

Assistant:

TEST(VerifyNameMatchInvalidDataTest, FailOnEmptyRdn) {
  std::string invalid;
  ASSERT_TRUE(LoadTestData("invalid", "RDN", "empty", &invalid));
  // Verification should fail due to RDN having zero AttributeTypeAndValues.
  EXPECT_FALSE(VerifyNameMatch(SequenceValueFromString(invalid),
                               SequenceValueFromString(invalid)));
  std::string normalized_der;
  CertErrors errors;
  EXPECT_FALSE(NormalizeName(SequenceValueFromString(invalid), &normalized_der,
                             &errors));
}